

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::Internal_ReadV5(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  active_space aVar1;
  SectionAttributesSource source_00;
  SectionFillRule rule;
  SectionLabelStyle style_00;
  object_decoration oVar2;
  wchar_t *candidate_name;
  bool local_4c2;
  byte local_4c1;
  undefined1 local_4c0 [6];
  bool b;
  uchar c_3;
  ON_SectionStyle sectionStyle;
  ON_Linetype lt;
  ON_SectionStyle ss_3;
  undefined1 local_2d8 [7];
  uchar c_2;
  ON_Xform object_frame;
  bool visible;
  double dStack_250;
  ON_Color color;
  double scale;
  ON_SectionStyle ss_2;
  double hatch_rotation;
  ON_SectionStyle ss_1;
  double hatch_scale;
  ON_SectionStyle ss;
  int hatch_index;
  uchar section_attr_source;
  ON_UuidList selectiveClipping;
  bool clipping_proof;
  uchar clip_participation_source;
  uchar style_1;
  uchar source_1;
  uchar style;
  uchar source;
  uchar c_1;
  uchar c;
  ON_wString local_30;
  ON_wString name;
  int iStack_20;
  bool rc;
  int minor_version;
  int major_version;
  uchar itemid;
  ON_BinaryArchive *file_local;
  ON_3dmObjectAttributes *this_local;
  
  minor_version._3_1_ = 0xff;
  iStack_20 = 0;
  name.m_s._4_4_ = 0;
  _major_version = file;
  file_local = (ON_BinaryArchive *)this;
  name.m_s._3_1_ =
       ON_BinaryArchive::Read3dmChunkVersion
                 (file,&stack0xffffffffffffffe0,(int *)((long)&name.m_s + 4));
  if (((bool)name.m_s._3_1_) && (iStack_20 != 2)) {
    name.m_s._3_1_ = false;
  }
  if ((((((bool)name.m_s._3_1_ != false) && ((bool)name.m_s._3_1_ != false)) &&
       (name.m_s._3_1_ = ON_BinaryArchive::ReadUuid(_major_version,&this->m_uuid),
       (bool)name.m_s._3_1_)) &&
      ((name.m_s._3_1_ =
             ON_BinaryArchive::Read3dmReferencedComponentIndex
                       (_major_version,Layer,&this->m_layer_index), (bool)name.m_s._3_1_ &&
       (name.m_s._3_1_ =
             ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
       (bool)name.m_s._3_1_)))) && (minor_version._3_1_ != 0)) {
    if (minor_version._3_1_ == 1) {
      ON_wString::ON_wString(&local_30);
      name.m_s._3_1_ = ON_BinaryArchive::ReadString(_major_version,&local_30);
      if ((bool)name.m_s._3_1_) {
        candidate_name = ON_wString::operator_cast_to_wchar_t_(&local_30);
        SetName(this,candidate_name,true);
        name.m_s._3_1_ =
             ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3));
        if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
          _clipping_proof = 0;
        }
        else {
          _clipping_proof = 3;
        }
      }
      else {
        _clipping_proof = 3;
      }
      ON_wString::~ON_wString(&local_30);
      if (_clipping_proof != 0) goto LAB_0044657c;
    }
    if (((((((minor_version._3_1_ != 2) ||
            (((name.m_s._3_1_ = ON_BinaryArchive::ReadString(_major_version,&this->m_url),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
           ((minor_version._3_1_ != 3 ||
            (((name.m_s._3_1_ =
                    ON_BinaryArchive::Read3dmReferencedComponentIndex
                              (_major_version,LinePattern,&this->m_linetype_index),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
          ((minor_version._3_1_ != 4 ||
           (((name.m_s._3_1_ =
                   ON_BinaryArchive::Read3dmReferencedComponentIndex
                             (_major_version,Material,&this->m_material_index), (bool)name.m_s._3_1_
             && (name.m_s._3_1_ =
                      ON_BinaryArchive::ReadChar
                                (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
         ((minor_version._3_1_ != 5 ||
          (((name.m_s._3_1_ =
                  ON_ObjectRenderingAttributes::Read(&this->m_rendering_attributes,_major_version),
            (bool)name.m_s._3_1_ &&
            (name.m_s._3_1_ =
                  ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3))
            , (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
        ((minor_version._3_1_ != 6 ||
         (((name.m_s._3_1_ = ON_BinaryArchive::ReadColor(_major_version,&this->m_color),
           (bool)name.m_s._3_1_ &&
           (name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
           (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
       (((minor_version._3_1_ != 7 ||
         (((name.m_s._3_1_ = ON_BinaryArchive::ReadColor(_major_version,&this->m_plot_color),
           (bool)name.m_s._3_1_ &&
           (name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
           (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
        ((minor_version._3_1_ != 8 ||
         (((name.m_s._3_1_ = ON_BinaryArchive::ReadDouble(_major_version,&this->m_plot_weight_mm),
           (bool)name.m_s._3_1_ &&
           (name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
           (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))))) {
      if (minor_version._3_1_ == 9) {
        selectiveClipping.m_removed_count._3_1_ = 0;
        name.m_s._3_1_ =
             ON_BinaryArchive::ReadChar
                       (_major_version,(ON__UINT8 *)((long)&selectiveClipping.m_removed_count + 3));
        if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
        oVar2 = ON::ObjectDecoration((uint)selectiveClipping.m_removed_count._3_1_);
        this->m_object_decoration = oVar2;
        name.m_s._3_1_ =
             ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3));
        if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
      }
      if (((((minor_version._3_1_ != 10) ||
            (((name.m_s._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&this->m_wire_density),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
           (((minor_version._3_1_ != 0xb ||
             (((name.m_s._3_1_ = ON_BinaryArchive::ReadBool(_major_version,&this->m_bVisible),
               (bool)name.m_s._3_1_ &&
               (name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
               (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
            ((minor_version._3_1_ != 0xc ||
             (((name.m_s._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_mode),
               (bool)name.m_s._3_1_ &&
               (name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
               (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))))) &&
          ((minor_version._3_1_ != 0xd ||
           (((name.m_s._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_color_source),
             (bool)name.m_s._3_1_ &&
             (name.m_s._3_1_ =
                   ON_BinaryArchive::ReadChar
                             (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
             (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
         ((((minor_version._3_1_ != 0xe ||
            (((name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar(_major_version,&this->m_plot_color_source),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
           ((minor_version._3_1_ != 0xf ||
            (((name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar(_major_version,&this->m_plot_weight_source),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) &&
          (((minor_version._3_1_ != 0x10 ||
            (((name.m_s._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_material_source),
              (bool)name.m_s._3_1_ &&
              (name.m_s._3_1_ =
                    ON_BinaryArchive::ReadChar
                              (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
              (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
           (((minor_version._3_1_ != 0x11 ||
             (((name.m_s._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_linetype_source)
               , (bool)name.m_s._3_1_ &&
               (name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
               (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
            ((minor_version._3_1_ != 0x12 ||
             (((name.m_s._3_1_ =
                     ON_BinaryArchive::Read3dmReferencedComponentIndexArray
                               (_major_version,Group,&this->m_group), (bool)name.m_s._3_1_ &&
               (name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
               (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))))))))) {
        if (minor_version._3_1_ == 0x13) {
          selectiveClipping.m_removed_count._2_1_ = 0;
          name.m_s._3_1_ =
               ON_BinaryArchive::ReadChar
                         (_major_version,(ON__UINT8 *)((long)&selectiveClipping.m_removed_count + 2)
                         );
          if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
          aVar1 = ON::ActiveSpace((uint)selectiveClipping.m_removed_count._2_1_);
          this->m_space = aVar1;
          name.m_s._3_1_ =
               ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&minor_version + 3));
          if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
        }
        if ((((((minor_version._3_1_ != 0x14) ||
               (((name.m_s._3_1_ = ON_BinaryArchive::ReadUuid(_major_version,&this->m_viewport_id),
                 (bool)name.m_s._3_1_ &&
                 (name.m_s._3_1_ =
                       ON_BinaryArchive::ReadChar
                                 (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                 (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))) &&
              ((minor_version._3_1_ != 0x15 ||
               (((name.m_s._3_1_ = ON_BinaryArchive::ReadArray(_major_version,&this->m_dmref),
                 (bool)name.m_s._3_1_ &&
                 (name.m_s._3_1_ =
                       ON_BinaryArchive::ReadChar
                                 (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                 (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) && (0 < name.m_s._4_4_))
            && ((minor_version._3_1_ != 0x16 ||
                (((name.m_s._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&this->m_display_order)
                  , (bool)name.m_s._3_1_ &&
                  (name.m_s._3_1_ =
                        ON_BinaryArchive::ReadChar
                                  (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                  (bool)name.m_s._3_1_)) && (minor_version._3_1_ != 0)))))) && (1 < name.m_s._4_4_))
        {
          if (minor_version._3_1_ == 0x17) {
            selectiveClipping.m_removed_count._1_1_ = 0;
            name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar
                           (_major_version,
                            (ON__UINT8 *)((long)&selectiveClipping.m_removed_count + 1));
            if (((!(bool)name.m_s._3_1_) ||
                (name.m_s._3_1_ =
                      ON_BinaryArchive::ReadChar
                                (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
          }
          if (minor_version._3_1_ == 0x18) {
            selectiveClipping.m_removed_count._0_1_ = 0;
            name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar
                           (_major_version,(ON__UINT8 *)&selectiveClipping.m_removed_count);
            if (((!(bool)name.m_s._3_1_) ||
                (name.m_s._3_1_ =
                      ON_BinaryArchive::ReadChar
                                (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
          }
          if (minor_version._3_1_ == 0x19) {
            selectiveClipping.m_sorted_count._3_1_ = 0;
            name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar
                           (_major_version,
                            (ON__UINT8 *)((long)&selectiveClipping.m_sorted_count + 3));
            if (((!(bool)name.m_s._3_1_) ||
                (name.m_s._3_1_ =
                      ON_BinaryArchive::ReadChar
                                (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
          }
          if (minor_version._3_1_ == 0x1a) {
            selectiveClipping.m_sorted_count._2_1_ = 0;
            name.m_s._3_1_ =
                 ON_BinaryArchive::ReadChar
                           (_major_version,
                            (ON__UINT8 *)((long)&selectiveClipping.m_sorted_count + 2));
            if (((!(bool)name.m_s._3_1_) ||
                (name.m_s._3_1_ =
                      ON_BinaryArchive::ReadChar
                                (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
          }
          if (2 < name.m_s._4_4_) {
            if (minor_version._3_1_ == 0x1b) {
              selectiveClipping.m_sorted_count._1_1_ = 0;
              name.m_s._3_1_ =
                   ON_BinaryArchive::ReadChar
                             (_major_version,
                              (ON__UINT8 *)((long)&selectiveClipping.m_sorted_count + 1));
              if (((!(bool)name.m_s._3_1_) ||
                  (name.m_s._3_1_ =
                        ON_BinaryArchive::ReadChar
                                  (_major_version,(ON__UINT8 *)((long)&minor_version + 3)),
                  !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
            }
            if (minor_version._3_1_ == 0x1c) {
              selectiveClipping.m_sorted_count._0_1_ = 0;
              name.m_s._3_1_ =
                   ON_BinaryArchive::ReadBool
                             (_major_version,(bool *)&selectiveClipping.m_sorted_count);
              if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
              ON_UuidList::ON_UuidList((ON_UuidList *)&hatch_index);
              name.m_s._3_1_ = ON_UuidList::Read((ON_UuidList *)&hatch_index,_major_version);
              if ((bool)name.m_s._3_1_) {
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                  _clipping_proof = 0;
                }
                else {
                  _clipping_proof = 3;
                }
              }
              else {
                _clipping_proof = 3;
              }
              ON_UuidList::~ON_UuidList((ON_UuidList *)&hatch_index);
              if (_clipping_proof != 0) goto LAB_0044657c;
            }
            if (3 < name.m_s._4_4_) {
              if (minor_version._3_1_ == 0x1d) {
                ss.m_private._7_1_ = 0;
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&ss.m_private + 7));
                if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                source_00 = ON::SectionAttributesSourceFromUnsigned((uint)ss.m_private._7_1_);
                SetSectionAttributesSource(this,source_00);
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
              }
              if (minor_version._3_1_ == 0x1e) {
                ss.m_private._0_4_ = 0;
                name.m_s._3_1_ =
                     ON_BinaryArchive::Read3dmReferencedComponentIndex
                               (_major_version,HatchPattern,(int *)&ss.m_private);
                if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&hatch_scale);
                CustomSectionStyle(this,(ON_SectionStyle *)&hatch_scale);
                ON_SectionStyle::SetHatchIndex((ON_SectionStyle *)&hatch_scale,(int)ss.m_private);
                SetCustomSectionStyle(this,(ON_SectionStyle *)&hatch_scale);
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                  _clipping_proof = 0;
                }
                else {
                  _clipping_proof = 3;
                }
                ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&hatch_scale);
                if (_clipping_proof != 0) goto LAB_0044657c;
              }
              if (minor_version._3_1_ == 0x1f) {
                ss_1.m_private = (ON_SectionStylePrivate *)0x3ff0000000000000;
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadDouble(_major_version,(double *)&ss_1.m_private);
                if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&hatch_rotation);
                CustomSectionStyle(this,(ON_SectionStyle *)&hatch_rotation);
                ON_SectionStyle::SetHatchScale
                          ((ON_SectionStyle *)&hatch_rotation,(double)ss_1.m_private);
                SetCustomSectionStyle(this,(ON_SectionStyle *)&hatch_rotation);
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                  _clipping_proof = 0;
                }
                else {
                  _clipping_proof = 3;
                }
                ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&hatch_rotation);
                if (_clipping_proof != 0) goto LAB_0044657c;
              }
              if (minor_version._3_1_ == 0x20) {
                ss_2.m_private = (ON_SectionStylePrivate *)0x0;
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadDouble(_major_version,(double *)&ss_2.m_private);
                if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&scale);
                CustomSectionStyle(this,(ON_SectionStyle *)&scale);
                ON_SectionStyle::SetHatchRotation((ON_SectionStyle *)&scale,(double)ss_2.m_private);
                SetCustomSectionStyle(this,(ON_SectionStyle *)&scale);
                name.m_s._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                  _clipping_proof = 0;
                }
                else {
                  _clipping_proof = 3;
                }
                ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&scale);
                if (_clipping_proof != 0) goto LAB_0044657c;
              }
              if (4 < name.m_s._4_4_) {
                if (minor_version._3_1_ == 0x21) {
                  dStack_250 = 1.0;
                  name.m_s._3_1_ =
                       ON_BinaryArchive::ReadDouble(_major_version,&stack0xfffffffffffffdb0);
                  if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                  SetLinetypePatternScale(this,dStack_250);
                  name.m_s._3_1_ =
                       ON_BinaryArchive::ReadChar
                                 (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                  if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
                }
                if (5 < name.m_s._4_4_) {
                  if (minor_version._3_1_ == 0x22) {
                    object_frame.m_xform[3][3]._4_4_ = ON_Color::UnsetColor.field_0;
                    name.m_s._3_1_ =
                         ON_BinaryArchive::ReadColor
                                   (_major_version,
                                    (ON_Color *)((long)object_frame.m_xform[3] + 0x1c));
                    if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                    SetHatchBackgroundFillColor
                              (this,(ON_Color *)((long)object_frame.m_xform[3] + 0x1c));
                    name.m_s._3_1_ =
                         ON_BinaryArchive::ReadChar
                                   (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                    if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
                  }
                  if (minor_version._3_1_ == 0x23) {
                    object_frame.m_xform[3][3]._3_1_ = 0;
                    name.m_s._3_1_ =
                         ON_BinaryArchive::ReadBool
                                   (_major_version,(bool *)((long)object_frame.m_xform[3] + 0x1b));
                    if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                    SetHatchBoundaryVisible(this,(bool)(object_frame.m_xform[3][3]._3_1_ & 1));
                    name.m_s._3_1_ =
                         ON_BinaryArchive::ReadChar
                                   (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                    if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
                  }
                  if ((6 < name.m_s._4_4_) && (7 < name.m_s._4_4_)) {
                    if (minor_version._3_1_ == 0x24) {
                      memcpy(local_2d8,&ON_Xform::Nan,0x80);
                      name.m_s._3_1_ =
                           ON_BinaryArchive::ReadXform(_major_version,(ON_Xform *)local_2d8);
                      if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                      memcpy(&this->m_object_frame,&ON_Plane::World_xy,0x80);
                      ON_Plane::Transform(&this->m_object_frame,(ON_Xform *)local_2d8);
                      name.m_s._3_1_ =
                           ON_BinaryArchive::ReadChar
                                     (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                      if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0)) goto LAB_0044657c;
                    }
                    if (8 < name.m_s._4_4_) {
                      if (minor_version._3_1_ == 0x25) {
                        ss_3.m_private._7_1_ = 0;
                        name.m_s._3_1_ =
                             ON_BinaryArchive::ReadChar
                                       (_major_version,(ON__UINT8 *)((long)&ss_3.m_private + 7));
                        if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                        ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&lt.m_width_units);
                        CustomSectionStyle(this,(ON_SectionStyle *)&lt.m_width_units);
                        rule = ON::SectionFillRuleFromUnsigned((uint)ss_3.m_private._7_1_);
                        ON_SectionStyle::SetSectionFillRule
                                  ((ON_SectionStyle *)&lt.m_width_units,rule);
                        name.m_s._3_1_ =
                             ON_BinaryArchive::ReadChar
                                       (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                        if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                          _clipping_proof = 0;
                        }
                        else {
                          _clipping_proof = 3;
                        }
                        ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&lt.m_width_units);
                        if (_clipping_proof != 0) goto LAB_0044657c;
                      }
                      if (9 < name.m_s._4_4_) {
                        if (minor_version._3_1_ == 0x26) {
                          ON_Linetype::ON_Linetype((ON_Linetype *)&sectionStyle.m_private);
                          name.m_s._3_1_ =
                               ON_Linetype::Read((ON_Linetype *)&sectionStyle.m_private,
                                                 _major_version);
                          if ((bool)name.m_s._3_1_) {
                            SetCustomLinetype(this,(ON_Linetype *)&sectionStyle.m_private);
                            name.m_s._3_1_ =
                                 ON_BinaryArchive::ReadChar
                                           (_major_version,(ON__UINT8 *)((long)&minor_version + 3));
                            if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                              _clipping_proof = 0;
                            }
                            else {
                              _clipping_proof = 3;
                            }
                          }
                          else {
                            _clipping_proof = 3;
                          }
                          ON_Linetype::~ON_Linetype((ON_Linetype *)&sectionStyle.m_private);
                          if (_clipping_proof != 0) goto LAB_0044657c;
                        }
                        if (10 < name.m_s._4_4_) {
                          if (minor_version._3_1_ == 0x27) {
                            ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)local_4c0);
                            name.m_s._3_1_ =
                                 ON_SectionStyle::Read((ON_SectionStyle *)local_4c0,_major_version);
                            if ((bool)name.m_s._3_1_) {
                              SetCustomSectionStyle(this,(ON_SectionStyle *)local_4c0);
                              name.m_s._3_1_ =
                                   ON_BinaryArchive::ReadChar
                                             (_major_version,(ON__UINT8 *)((long)&minor_version + 3)
                                             );
                              if (((bool)name.m_s._3_1_) && (minor_version._3_1_ != 0)) {
                                _clipping_proof = 0;
                              }
                              else {
                                _clipping_proof = 3;
                              }
                            }
                            else {
                              _clipping_proof = 3;
                            }
                            ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)local_4c0);
                            if (_clipping_proof != 0) goto LAB_0044657c;
                          }
                          if (0xb < name.m_s._4_4_) {
                            if (minor_version._3_1_ == 0x28) {
                              local_4c1 = 0;
                              name.m_s._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&local_4c1)
                              ;
                              if (!(bool)name.m_s._3_1_) goto LAB_0044657c;
                              style_00 = ON::SectionLabelStyleFromUnsigned((uint)local_4c1);
                              SetClippingPlaneLabelStyle(this,style_00);
                              name.m_s._3_1_ =
                                   ON_BinaryArchive::ReadChar
                                             (_major_version,(ON__UINT8 *)((long)&minor_version + 3)
                                             );
                              if ((!(bool)name.m_s._3_1_) || (minor_version._3_1_ == 0))
                              goto LAB_0044657c;
                            }
                            if (0xc < name.m_s._4_4_) {
                              if (minor_version._3_1_ == 0x29) {
                                local_4c2 = true;
                                name.m_s._3_1_ =
                                     ON_BinaryArchive::ReadBool(_major_version,&local_4c2);
                                if (((!(bool)name.m_s._3_1_) ||
                                    (name.m_s._3_1_ =
                                          ON_BinaryArchive::ReadChar
                                                    (_major_version,
                                                     (ON__UINT8 *)((long)&minor_version + 3)),
                                    !(bool)name.m_s._3_1_)) || (minor_version._3_1_ == 0))
                                goto LAB_0044657c;
                              }
                              if ((0xd < name.m_s._4_4_) && (0x29 < minor_version._3_1_)) {
                                minor_version._3_1_ = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0044657c:
  if (((name.m_s._3_1_ & 1) != 0) && (minor_version._3_1_ != 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
               ,0x392,"","Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
  }
  return (bool)(name.m_s._3_1_ & 1);
}

Assistant:

bool ON_3dmObjectAttributes::Internal_ReadV5( ON_BinaryArchive& file )
{
  unsigned char itemid = 0xFF;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && 2 != major_version )
    rc = false;

  while(rc)
  {
    if (!rc) break;
    rc = file.ReadUuid(m_uuid);
    if (!rc) break;
    //rc = file.ReadInt(&m_layer_index);
    rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &m_layer_index);
    if (!rc) break;

    // read non-default settings - skip everything else
    rc = file.ReadChar(&itemid);
    if (!rc) break;
    if ( 0 == itemid )
      break;
    
    if ( 1 == itemid )
    {
      ON_wString name;
      rc = file.ReadString(name);
      if (!rc) break;
      SetName(name,true);

      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 2 == itemid )
    {
      rc = file.ReadString(m_url);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 3 == itemid )
    {
      //rc = file.ReadInt(&m_linetype_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::LinePattern, &m_linetype_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 4 == itemid )
    {
      //rc = file.ReadInt(&m_material_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial, &m_material_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 5 == itemid )
    {
      rc = m_rendering_attributes.Read(file);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 6 == itemid )
    {
      rc = file.ReadColor(m_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 7 == itemid )
    {
      rc = file.ReadColor(m_plot_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 8 == itemid )
    {
      rc = file.ReadDouble(&m_plot_weight_mm);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 9 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_object_decoration = ON::ObjectDecoration(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 10 == itemid )
    {
      rc = file.ReadInt(&m_wire_density);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 11 == itemid )
    {
      rc = file.ReadBool(&m_bVisible);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 12 == itemid )
    {
      rc = file.ReadChar(&m_mode);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 13 == itemid )
    {
      rc = file.ReadChar(&m_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 14 == itemid )
    {
      rc = file.ReadChar(&m_plot_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 15 == itemid )
    {
      rc = file.ReadChar(&m_plot_weight_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 16 == itemid )
    {
      rc = file.ReadChar(&m_material_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 17 == itemid )
    {
      rc = file.ReadChar(&m_linetype_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 18 == itemid )
    {
      rc = file.Read3dmReferencedComponentIndexArray(ON_ModelComponent::Type::Group, m_group);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 19 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_space = ON::ActiveSpace(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 20 == itemid )
    {
      rc = file.ReadUuid(m_viewport_id);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 21 == itemid )
    {
      rc = file.ReadArray(m_dmref);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    // items 1 - 21 are in chunk version 2.0 files
    if ( minor_version <= 0 )
      break;

    // 28 Nov. 2009 - S. Baer
    // Added m_display_order to version 2.1 files
    if ( 22 == itemid )
    {
      rc = file.ReadInt(&m_display_order);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    if ( minor_version <= 1 )
      break;

    // 12 Aug 2021 S. Baer
    // Items 23, 24, 25, 26 were in a version of Rhino 8 WIP for about 24 hours.
    // They were most likely never used by anyone, but just in case let's test,
    // read, and throw away.
    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyleSource == itemid) //23
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineCapStyleSource(ON::ObjectLineCapStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyle == itemid) //24
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineCapStyle(ON::LineCapStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyleSource == itemid) //25
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineJoinStyleSource(ON::ObjectLineJoinStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyle == itemid) //26
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineJoinStyle(ON::LineJoinStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 2)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteClipParticipationSource == itemid) //27
    {
      unsigned char clip_participation_source = 0;
      rc = file.ReadChar(&clip_participation_source);
      if (!rc) break;
      //SetClipParticipationSource(ON::ClipParticipationSourceFromUnsigned(clip_participation_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::SelectiveClippingData == itemid) //28
    {
      bool clipping_proof = false;
      rc = file.ReadBool(&clipping_proof);
      if (!rc) break;
      ON_UuidList selectiveClipping;
      rc = selectiveClipping.Read(file);
      if (!rc) break;
      //if (clipping_proof)
      //  SetClipParticipationForNone();
      //else
      //{
      //  if (selectiveClipping.Count() > 0)
      //  {
      //    SetClipParticipationList(selectiveClipping.Array(), selectiveClipping.Count(), true);
      //  }
      //}
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 3)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionAttributesSource == itemid) //29
    {
      unsigned char section_attr_source = 0;
      rc = file.ReadChar(&section_attr_source);
      if (!rc) break;
      SetSectionAttributesSource(ON::SectionAttributesSourceFromUnsigned(section_attr_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchIndex == itemid) //30
    {
      int hatch_index = 0;
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &hatch_index);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchIndex(hatch_index);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchScale == itemid) //31
    {
      double hatch_scale = 1;
      rc = file.ReadDouble(&hatch_scale);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchScale(hatch_scale);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchRotation == itemid) //32
    {
      double hatch_rotation = 0;
      rc = file.ReadDouble(&hatch_rotation);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchRotation(hatch_rotation);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 4)
      break;

    if (ON_3dmObjectAttributesTypeCodes::LinetypeScale == itemid) //33
    {
      double scale = 1.0;
      rc = file.ReadDouble(&scale);
      if (!rc) break;
      SetLinetypePatternScale(scale);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 5)
      break;

    if (ON_3dmObjectAttributesTypeCodes::HatchBackgroundFill == itemid) // 34
    {
      ON_Color color = ON_Color::UnsetColor;
      rc = file.ReadColor(color);
      if (!rc) break;
      SetHatchBackgroundFillColor(color);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::HatchBoundaryVisible == itemid) // 35
    {
      bool visible = false;
      rc = file.ReadBool(&visible);
      if (!rc) break;
      SetHatchBoundaryVisible(visible);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 6)
      break;

    // nothing added in 2.7
    if (minor_version <= 7)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObjectFrame == itemid) // 36
    {
      ON_Xform object_frame = ON_Xform::Nan;
      rc = file.ReadXform(object_frame);
      if (!rc) break;

      m_object_frame = ON_Plane::World_xy;
      m_object_frame.Transform(object_frame);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 8)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionFillRule == itemid) // 37
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 9)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomLinetype == itemid) // 38
    {
      ON_Linetype lt;
      rc = lt.Read(file);
      if (!rc) break;

      SetCustomLinetype(lt);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 10)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomSectionStyle == itemid) // 39
    {
      ON_SectionStyle sectionStyle;
      rc = sectionStyle.Read(file);
      if (!rc) break;

      SetCustomSectionStyle(sectionStyle);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 11)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ClippingPlaneLabelStyle == itemid) // 40
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      SetClippingPlaneLabelStyle(ON::SectionLabelStyleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 12)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteSelectiveClippingListType == itemid) // 41
    {
      bool b = true;
      rc = file.ReadBool(&b);
      if (!rc) break;
      //if (nullptr == m_private)
      //  m_private = new ON_3dmObjectAttributesPrivate(this);
      //m_private->m_clipplane_list_is_participation = b;

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 13)
      break;

    // Add new item reading above and increment the LastAttributeTypeCode value
    // in the enum. Be sure to test reading of old and new files by old and new
    // code, before checking in your changes.
    //
    if ( itemid > ON_3dmObjectAttributesTypeCodes::LastAttributeTypeCode )
    {
      // we are reading file written with code newer
      // than this code (minor_version > 2)
      itemid = 0;
    }

    break;
  }

  if ( rc && 0 != itemid )
  {
    ON_ERROR("Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
  }

  return rc;
}